

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_1.cpp
# Opt level: O0

void file_to_lower(string *in_filename,string *out_filename)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  ostream *poVar4;
  string local_4f0 [32];
  string local_4d0 [8];
  string line;
  string local_4b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490 [32];
  long local_470;
  ofstream out_file;
  string local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [48];
  long local_220;
  ifstream in_file;
  string *out_filename_local;
  string *in_filename_local;
  
  std::ifstream::ifstream(&local_220,in_filename,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::operator+((char *)local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Could not open file \'");
    std::operator+(local_250,(char *)local_270);
    error(local_250);
    std::__cxx11::string::~string((string *)local_250);
    std::__cxx11::string::~string(local_270);
  }
  std::ofstream::ofstream(&local_470,out_filename,0x10);
  bVar1 = std::ios::operator!((ios *)((long)&local_470 + *(long *)(local_470 + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::operator+((char *)local_4b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Could not open file \'");
    std::operator+(local_490,(char *)local_4b0);
    error(local_490);
    std::__cxx11::string::~string((string *)local_490);
    std::__cxx11::string::~string(local_4b0);
  }
  std::__cxx11::string::string(local_4d0);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_220,local_4d0);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar2) break;
    to_lower(local_4f0);
    poVar4 = std::operator<<((ostream *)&local_470,(string *)local_4f0);
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::~string((string *)local_4f0);
  }
  std::__cxx11::string::~string(local_4d0);
  std::ofstream::~ofstream(&local_470);
  std::ifstream::~ifstream(&local_220);
  return;
}

Assistant:

void file_to_lower(const std::string& in_filename, const std::string& out_filename)
{
	std::ifstream in_file{ in_filename };
	if (!in_file)
	{
		error("Could not open file '" + in_filename + "' for reading.");
	}
	std::ofstream out_file{ out_filename };
	if (!out_file)
	{
		error("Could not open file '" + in_filename + "' for reading.");
	}
	std::string line;
	while (std::getline(in_file, line))
	{
		out_file << to_lower(line) << '\n';
	}
}